

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpheaders.c
# Opt level: O0

HTTP_HEADERS_RESULT
HTTPHeaders_GetHeader(HTTP_HEADERS_HANDLE handle,size_t index,char **destination)

{
  undefined1 auVar1 [16];
  MAP_RESULT MVar2;
  HTTP_HEADERS_HANDLE_DATA *pHVar3;
  char *pcVar4;
  LOGGER_LOG p_Var5;
  size_t __n;
  size_t sVar6;
  undefined8 in_stack_ffffffffffffff08;
  undefined4 uVar7;
  size_t local_d8;
  size_t local_d0;
  ulong local_c8;
  ulong local_c0;
  ulong local_b8;
  char *runDestination;
  LOGGER_LOG l_3;
  size_t malloc_size;
  size_t valueLen;
  size_t keyLen;
  LOGGER_LOG l_2;
  LOGGER_LOG l_1;
  size_t headerCount;
  char **values;
  char **keys;
  HTTP_HEADERS_HANDLE_DATA *handleData;
  LOGGER_LOG l;
  char **ppcStack_30;
  HTTP_HEADERS_RESULT result;
  char **destination_local;
  size_t index_local;
  HTTP_HEADERS_HANDLE handle_local;
  
  uVar7 = (undefined4)((ulong)in_stack_ffffffffffffff08 >> 0x20);
  l._4_4_ = 1;
  ppcStack_30 = destination;
  destination_local = (char **)index;
  index_local = (size_t)handle;
  if ((handle == (HTTP_HEADERS_HANDLE)0x0) || (destination == (char **)0x0)) {
    l._4_4_ = HTTP_HEADERS_INVALID_ARG;
    pHVar3 = (HTTP_HEADERS_HANDLE_DATA *)xlogging_get_log_function();
    if (pHVar3 != (HTTP_HEADERS_HANDLE_DATA *)0x0) {
      handleData = pHVar3;
      pcVar4 = HTTP_HEADERS_RESULTStrings(l._4_4_);
      (*(code *)pHVar3)(0,
                        "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-umqtt-c/deps/c-utility/src/httpheaders.c"
                        ,"HTTPHeaders_GetHeader",0xff,1,"invalid arg (NULL), result= %s%s (%d)","",
                        pcVar4,CONCAT44(uVar7,l._4_4_));
    }
  }
  else {
    keys = (char **)handle;
    MVar2 = Map_GetInternals(handle->headers,&values,(char ***)&headerCount,(size_t *)&l_1);
    if (MVar2 == MAP_OK) {
      if (destination_local < l_1) {
        __n = strlen(values[(long)destination_local]);
        sVar6 = strlen(*(char **)(headerCount + (long)destination_local * 8));
        if (__n < 0xfffffffffffffffd) {
          local_b8 = __n + 2;
        }
        else {
          local_b8 = 0xffffffffffffffff;
        }
        if (local_b8 < -sVar6 - 1) {
          local_c0 = local_b8 + sVar6;
        }
        else {
          local_c0 = 0xffffffffffffffff;
        }
        if (local_c0 < 0xfffffffffffffffe) {
          local_c8 = local_c0 + 1;
        }
        else {
          local_c8 = 0xffffffffffffffff;
        }
        if (local_c8 == 0) {
          local_d0 = 0;
        }
        else {
          auVar1._8_8_ = 0;
          auVar1._0_8_ = local_c8;
          if (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0xffffffffffffffff)) / auVar1,0) == 0) {
            local_d8 = 0xffffffffffffffff;
          }
          else {
            local_d8 = local_c8;
          }
          local_d0 = local_d8;
        }
        if (local_d0 != 0xffffffffffffffff) {
          pcVar4 = (char *)malloc(local_d0);
          *ppcStack_30 = pcVar4;
          if (pcVar4 != (char *)0x0) {
            pcVar4 = *ppcStack_30;
            memcpy(pcVar4,values[(long)destination_local],__n);
            pcVar4 = pcVar4 + __n;
            *pcVar4 = ':';
            pcVar4[1] = ' ';
            memcpy(pcVar4 + 2,*(void **)(headerCount + (long)destination_local * 8),sVar6 + 1);
            return HTTP_HEADERS_OK;
          }
        }
        l._4_4_ = HTTP_HEADERS_ERROR;
        *ppcStack_30 = (char *)0x0;
        p_Var5 = xlogging_get_log_function();
        if (p_Var5 != (LOGGER_LOG)0x0) {
          pcVar4 = HTTP_HEADERS_RESULTStrings(l._4_4_);
          (*p_Var5)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-umqtt-c/deps/c-utility/src/httpheaders.c"
                    ,"HTTPHeaders_GetHeader",0x124,1,"unable to malloc, size=%zu, result= %s%s (%d)"
                    ,local_d0,"",pcVar4,l._4_4_);
        }
      }
      else {
        l._4_4_ = HTTP_HEADERS_INVALID_ARG;
        p_Var5 = xlogging_get_log_function();
        if (p_Var5 != (LOGGER_LOG)0x0) {
          pcVar4 = HTTP_HEADERS_RESULTStrings(l._4_4_);
          (*p_Var5)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-umqtt-c/deps/c-utility/src/httpheaders.c"
                    ,"HTTPHeaders_GetHeader",0x114,1,"index out of bounds, result= %s%s (%d)","",
                    pcVar4,CONCAT44(uVar7,l._4_4_));
        }
      }
    }
    else {
      l._4_4_ = HTTP_HEADERS_ERROR;
      p_Var5 = xlogging_get_log_function();
      if (p_Var5 != (LOGGER_LOG)0x0) {
        pcVar4 = HTTP_HEADERS_RESULTStrings(l._4_4_);
        (*p_Var5)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-umqtt-c/deps/c-utility/src/httpheaders.c"
                  ,"HTTPHeaders_GetHeader",0x10c,1,"Map_GetInternals failed, result= %s%s (%d)","",
                  pcVar4,CONCAT44(uVar7,l._4_4_));
      }
    }
  }
  return l._4_4_;
}

Assistant:

HTTP_HEADERS_RESULT HTTPHeaders_GetHeader(HTTP_HEADERS_HANDLE handle, size_t index, char** destination)
{
    HTTP_HEADERS_RESULT result = HTTP_HEADERS_OK;

    /*Codes_SRS_HTTP_HEADERS_99_028:[ The function shall return NULL if the handle is invalid.]*/
    /*Codes_SRS_HTTP_HEADERS_99_032:[ The function shall return HTTP_HEADERS_INVALID_ARG if the destination  is NULL]*/
    if (
        (handle == NULL) ||
        (destination == NULL)
        )
    {
        result = HTTP_HEADERS_INVALID_ARG;
        LogError("invalid arg (NULL), result= %" PRI_MU_ENUM "", MU_ENUM_VALUE(HTTP_HEADERS_RESULT, result));
    }
    /*Codes_SRS_HTTP_HEADERS_99_029:[ The function shall return HTTP_HEADERS_INVALID_ARG if index is not valid (for example, out of range) for the currently stored headers.]*/
    else
    {
        HTTP_HEADERS_HANDLE_DATA* handleData = (HTTP_HEADERS_HANDLE_DATA*)handle;
        const char*const* keys;
        const char*const* values;
        size_t headerCount;
        if (Map_GetInternals(handleData->headers, &keys, &values, &headerCount) != MAP_OK)
        {
            /*Codes_SRS_HTTP_HEADERS_99_034:[ The function shall return HTTP_HEADERS_ERROR when an internal error occurs]*/
            result = HTTP_HEADERS_ERROR;
            LogError("Map_GetInternals failed, result= %" PRI_MU_ENUM "", MU_ENUM_VALUE(HTTP_HEADERS_RESULT, result));
        }
        else
        {
            /*Codes_SRS_HTTP_HEADERS_99_029:[ The function shall return HTTP_HEADERS_INVALID_ARG if index is not valid (for example, out of range) for the currently stored headers.]*/
            if (index >= headerCount)
            {
                result = HTTP_HEADERS_INVALID_ARG;
                LogError("index out of bounds, result= %" PRI_MU_ENUM "", MU_ENUM_VALUE(HTTP_HEADERS_RESULT, result));
            }
            else
            {
                size_t keyLen = strlen(keys[index]);
                size_t valueLen = strlen(values[index]);
                size_t malloc_size = safe_add_size_t(keyLen, /*COLON_AND_SPACE_LENGTH*/ 2);
                malloc_size = safe_add_size_t(malloc_size, valueLen);
                malloc_size = safe_add_size_t(malloc_size, /*EOL*/ 1);
                malloc_size = safe_multiply_size_t(malloc_size, sizeof(char));
                if (malloc_size == SIZE_MAX ||
                    (*destination = (char*)malloc(malloc_size)) == NULL)
                {
                    /*Codes_SRS_HTTP_HEADERS_99_034:[ The function shall return HTTP_HEADERS_ERROR when an internal error occurs]*/
                    result = HTTP_HEADERS_ERROR;
                    *destination = NULL;
                    LogError("unable to malloc, size=%zu, result= %" PRI_MU_ENUM "", malloc_size, MU_ENUM_VALUE(HTTP_HEADERS_RESULT, result));
                }
                else
                {
                    /*Codes_SRS_HTTP_HEADERS_99_016:[ The function shall store the name:value pair in such a way that when later retrieved by a call to GetHeader it will return a string that shall strcmp equal to the name+": "+value.]*/
                    /*Codes_SRS_HTTP_HEADERS_99_027:[ Calling this API shall produce the string value+": "+pair) for the index header in the *destination parameter.]*/
                    char* runDestination = (*destination);
                    (void)memcpy(runDestination, keys[index], keyLen);
                    runDestination += keyLen;
                    (*runDestination++) = ':';
                    (*runDestination++) = ' ';
                    (void)memcpy(runDestination, values[index], valueLen + /*EOL*/ 1);
                    /*Codes_SRS_HTTP_HEADERS_99_035:[ The function shall return HTTP_HEADERS_OK when the function executed without error.]*/
                    result = HTTP_HEADERS_OK;
                }
            }
        }
    }

    return result;
}